

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O0

char * xmlURIUnescapeString(char *str,int len,char *target)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  char *local_40;
  char *in;
  char *out;
  char *ret;
  char *target_local;
  int len_local;
  char *str_local;
  
  if (str == (char *)0x0) {
    str_local = (char *)0x0;
  }
  else {
    target_local._4_4_ = len;
    if (len < 1) {
      sVar2 = strlen(str);
      target_local._4_4_ = (int)sVar2;
    }
    if (target_local._4_4_ < 0) {
      str_local = (char *)0x0;
    }
    else {
      out = target;
      if ((target == (char *)0x0) &&
         (out = (char *)(*xmlMallocAtomic)((long)(target_local._4_4_ + 1)), out == (char *)0x0)) {
        xmlURIErrMemory("unescaping URI value\n");
        str_local = (char *)0x0;
      }
      else {
        in = out;
        local_40 = str;
        while (0 < target_local._4_4_) {
          if ((((target_local._4_4_ < 3) || (*local_40 != '%')) ||
              (iVar1 = is_hex(local_40[1]), iVar1 == 0)) ||
             (iVar1 = is_hex(local_40[2]), iVar1 == 0)) {
            *in = *local_40;
            target_local._4_4_ = target_local._4_4_ + -1;
            local_40 = local_40 + 1;
          }
          else {
            pcVar3 = local_40 + 1;
            if ((*pcVar3 < '0') || ('9' < *pcVar3)) {
              if ((*pcVar3 < 'a') || ('f' < *pcVar3)) {
                if (('@' < *pcVar3) && (*pcVar3 < 'G')) {
                  *in = *pcVar3 + -0x37;
                }
              }
              else {
                *in = *pcVar3 + -0x57;
              }
            }
            else {
              *in = *pcVar3 + -0x30;
            }
            pcVar3 = local_40 + 2;
            if ((*pcVar3 < '0') || ('9' < *pcVar3)) {
              if ((*pcVar3 < 'a') || ('f' < *pcVar3)) {
                if (('@' < *pcVar3) && (*pcVar3 < 'G')) {
                  *in = *in * '\x10' + *pcVar3 + -0x37;
                }
              }
              else {
                *in = *in * '\x10' + *pcVar3 + -0x57;
              }
            }
            else {
              *in = *in * '\x10' + *pcVar3 + -0x30;
            }
            target_local._4_4_ = target_local._4_4_ + -3;
            local_40 = local_40 + 3;
          }
          in = in + 1;
        }
        *in = '\0';
        str_local = out;
      }
    }
  }
  return str_local;
}

Assistant:

char *
xmlURIUnescapeString(const char *str, int len, char *target) {
    char *ret, *out;
    const char *in;

    if (str == NULL)
	return(NULL);
    if (len <= 0) len = strlen(str);
    if (len < 0) return(NULL);

    if (target == NULL) {
	ret = (char *) xmlMallocAtomic(len + 1);
	if (ret == NULL) {
            xmlURIErrMemory("unescaping URI value\n");
	    return(NULL);
	}
    } else
	ret = target;
    in = str;
    out = ret;
    while(len > 0) {
	if ((len > 2) && (*in == '%') && (is_hex(in[1])) && (is_hex(in[2]))) {
	    in++;
	    if ((*in >= '0') && (*in <= '9'))
	        *out = (*in - '0');
	    else if ((*in >= 'a') && (*in <= 'f'))
	        *out = (*in - 'a') + 10;
	    else if ((*in >= 'A') && (*in <= 'F'))
	        *out = (*in - 'A') + 10;
	    in++;
	    if ((*in >= '0') && (*in <= '9'))
	        *out = *out * 16 + (*in - '0');
	    else if ((*in >= 'a') && (*in <= 'f'))
	        *out = *out * 16 + (*in - 'a') + 10;
	    else if ((*in >= 'A') && (*in <= 'F'))
	        *out = *out * 16 + (*in - 'A') + 10;
	    in++;
	    len -= 3;
	    out++;
	} else {
	    *out++ = *in++;
	    len--;
	}
    }
    *out = 0;
    return(ret);
}